

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O3

bool __thiscall
cmMakefile::AddRequiredTargetCFeature
          (cmMakefile *this,cmTarget *target,string *feature,string *error)

{
  pointer pcVar1;
  cmake *this_00;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  char *__s;
  char **ppcVar5;
  string *psVar6;
  ostream *poVar7;
  size_t sVar8;
  char **ppcVar9;
  byte bVar10;
  byte bVar11;
  bool bVar12;
  bool needC11;
  bool needC99;
  bool needC90;
  ostringstream e;
  bool local_273;
  bool local_272;
  bool local_271;
  cmTarget *local_270;
  string local_268;
  long *local_248 [2];
  long local_238 [2];
  long *local_228 [2];
  long local_218 [2];
  long *local_208 [2];
  long local_1f8 [2];
  long *local_1e8 [2];
  long local_1d8 [2];
  long *local_1c8 [2];
  long local_1b8 [2];
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  local_271 = false;
  local_272 = false;
  local_273 = false;
  CheckNeededCLanguage(this,feature,&local_271,&local_272,&local_273);
  pcVar1 = local_1a8 + 0x10;
  local_1a8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"C_STANDARD","");
  __s = cmTarget::GetProperty(target,(string *)local_1a8);
  if ((pointer)local_1a8._0_8_ != pcVar1) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  local_270 = target;
  if (__s == (char *)0x0) {
    local_1a8._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"CMAKE_C_STANDARD_DEFAULT","");
    psVar6 = GetDef(this,(string *)local_1a8);
    if (psVar6 == (string *)0x0) {
      __s = (char *)0x0;
    }
    else {
      __s = (psVar6->_M_dataplus)._M_p;
    }
    if ((pointer)local_1a8._0_8_ != pcVar1) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    ppcVar5 = (char **)&DAT_005f5e18;
    if ((__s != (char *)0x0) && (*__s != '\0')) goto LAB_00186f20;
    bVar11 = 0;
  }
  else {
LAB_00186f20:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1c8,__s,(allocator<char> *)local_1a8);
    ppcVar5 = std::find_if<char_const*const*,cmStrCmp>
                        (C_STANDARDS,(char **)&DAT_005f5e18,(cmStrCmp *)local_1c8);
    if (local_1c8[0] != local_1b8) {
      operator_delete(local_1c8[0],local_1b8[0] + 1);
    }
    if (ppcVar5 == (char **)&DAT_005f5e18) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"The C_STANDARD property on target \"",0x23);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,(local_270->Name)._M_dataplus._M_p,
                          (local_270->Name)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,"\" contained an invalid value: \"",0x1f);
      sVar8 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,__s,sVar8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\".",2);
      if (error == (string *)0x0) {
        this_00 = this->GlobalGenerator->CMakeInstance;
        std::__cxx11::stringbuf::str();
        cmake::IssueMessage(this_00,FATAL_ERROR,&local_268,&this->Backtrace);
      }
      else {
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::operator=((string *)error,(string *)&local_268);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268._M_dataplus._M_p != &local_268.field_2) {
        operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
      return false;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1e8,__s,(allocator<char> *)local_1a8);
    ppcVar5 = std::find_if<char_const*const*,cmStrCmp>
                        (C_STANDARDS,(char **)&DAT_005f5e18,(cmStrCmp *)local_1e8);
    bVar11 = 1;
    if (local_1e8[0] != local_1d8) {
      operator_delete(local_1e8[0],local_1d8[0] + 1);
    }
  }
  bVar4 = local_271;
  bVar3 = local_272;
  bVar2 = local_273;
  if ((bVar11 & local_273) == 1) {
    local_208[0] = local_1f8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"11","");
    ppcVar9 = std::find_if<char_const*const*,cmStrCmp>
                        (C_STANDARDS,(char **)&DAT_005f5e18,(cmStrCmp *)local_208);
    if (local_208[0] != local_1f8) {
      operator_delete(local_208[0],local_1f8[0] + 1);
    }
    if (ppcVar9 <= ppcVar5) goto LAB_00187195;
LAB_0018727b:
    local_1a8._0_8_ = local_1a8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"C_STANDARD","");
    cmTarget::SetProperty(local_270,(string *)local_1a8,"11");
  }
  else {
LAB_00187195:
    bVar10 = bVar11 ^ 1;
    if ((bVar11 & bVar3) == 1) {
      local_248[0] = local_238;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_248,"99","");
      ppcVar9 = std::find_if<char_const*const*,cmStrCmp>
                          (C_STANDARDS,(char **)&DAT_005f5e18,(cmStrCmp *)local_248);
      if (local_248[0] != local_238) {
        operator_delete(local_248[0],local_238[0] + 1);
      }
      if (ppcVar9 <= ppcVar5) goto LAB_0018720e;
      if ((bVar2 & bVar10) != 0) goto LAB_0018727b;
    }
    else {
LAB_0018720e:
      if ((bVar11 & bVar4) == 1) {
        local_228[0] = local_218;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_228,"90","");
        ppcVar9 = std::find_if<char_const*const*,cmStrCmp>
                            (C_STANDARDS,(char **)&DAT_005f5e18,(cmStrCmp *)local_228);
        bVar12 = ppcVar5 < ppcVar9;
        if (local_228[0] != local_218) {
          operator_delete(local_228[0],local_218[0] + 1);
        }
      }
      else {
        bVar12 = false;
      }
      if ((bVar2 & bVar10) != 0) goto LAB_0018727b;
      if ((bVar3 & bVar10) == 0) {
        if (!bVar12 && (bVar10 & bVar4) == 0) {
          return true;
        }
        local_1a8._0_8_ = local_1a8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"C_STANDARD","");
        cmTarget::SetProperty(local_270,(string *)local_1a8,"90");
        if ((undefined1 *)local_1a8._0_8_ == local_1a8 + 0x10) {
          return true;
        }
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
        return true;
      }
    }
    local_1a8._0_8_ = local_1a8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"C_STANDARD","");
    cmTarget::SetProperty(local_270,(string *)local_1a8,"99");
  }
  if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  return true;
}

Assistant:

bool cmMakefile::AddRequiredTargetCFeature(cmTarget* target,
                                           const std::string& feature,
                                           std::string* error) const
{
  bool needC90 = false;
  bool needC99 = false;
  bool needC11 = false;

  this->CheckNeededCLanguage(feature, needC90, needC99, needC11);

  const char* existingCStandard = target->GetProperty("C_STANDARD");
  if (existingCStandard == nullptr) {
    const char* defaultCStandard =
      this->GetDefinition("CMAKE_C_STANDARD_DEFAULT");
    if (defaultCStandard && *defaultCStandard) {
      existingCStandard = defaultCStandard;
    }
  }
  if (existingCStandard) {
    if (std::find_if(cm::cbegin(C_STANDARDS), cm::cend(C_STANDARDS),
                     cmStrCmp(existingCStandard)) == cm::cend(C_STANDARDS)) {
      std::ostringstream e;
      e << "The C_STANDARD property on target \"" << target->GetName()
        << "\" contained an invalid value: \"" << existingCStandard << "\".";
      if (error) {
        *error = e.str();
      } else {
        this->GetCMakeInstance()->IssueMessage(MessageType::FATAL_ERROR,
                                               e.str(), this->Backtrace);
      }
      return false;
    }
  }
  const char* const* existingCIt = existingCStandard
    ? std::find_if(cm::cbegin(C_STANDARDS), cm::cend(C_STANDARDS),
                   cmStrCmp(existingCStandard))
    : cm::cend(C_STANDARDS);

  bool setC90 = needC90 && !existingCStandard;
  bool setC99 = needC99 && !existingCStandard;
  bool setC11 = needC11 && !existingCStandard;

  if (needC11 && existingCStandard &&
      existingCIt < std::find_if(cm::cbegin(C_STANDARDS),
                                 cm::cend(C_STANDARDS), cmStrCmp("11"))) {
    setC11 = true;
  } else if (needC99 && existingCStandard &&
             existingCIt < std::find_if(cm::cbegin(C_STANDARDS),
                                        cm::cend(C_STANDARDS),
                                        cmStrCmp("99"))) {
    setC99 = true;
  } else if (needC90 && existingCStandard &&
             existingCIt < std::find_if(cm::cbegin(C_STANDARDS),
                                        cm::cend(C_STANDARDS),
                                        cmStrCmp("90"))) {
    setC90 = true;
  }

  if (setC11) {
    target->SetProperty("C_STANDARD", "11");
  } else if (setC99) {
    target->SetProperty("C_STANDARD", "99");
  } else if (setC90) {
    target->SetProperty("C_STANDARD", "90");
  }
  return true;
}